

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_shl_64(c_v256 *__return_storage_ptr__,c_v256 a,uint n)

{
  c_v256 cVar1;
  c_v256 *extraout_RAX;
  undefined1 auVar2 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [16];
  
  auVar2 = in_ZMM0._0_32_;
  if (n < 0x40) {
    auVar3._4_4_ = 0;
    auVar3._0_4_ = n;
    auVar3._8_4_ = n;
    auVar3._12_4_ = 0;
    cVar1.u8 = (uint8_t  [32])vpsllq_avx2(a.u8,auVar3);
    *__return_storage_ptr__ = cVar1;
    return __return_storage_ptr__;
  }
  c_v256_shl_64();
  vpsllq_avx2(auVar2,ZEXT416(n));
  return extraout_RAX;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shl_64(c_v256 a, unsigned int n) {
  c_v256 t;
  if (SIMD_CHECK && n > 63) {
    fprintf(stderr, "Error: undefined s64 shift right %d\n", n);
    abort();
  }
  t.u64[3] = a.u64[3] << n;
  t.u64[2] = a.u64[2] << n;
  t.u64[1] = a.u64[1] << n;
  t.u64[0] = a.u64[0] << n;
  return t;
}